

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O2

void __thiscall urllib::Response::parseRespone(Response *this)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  lVar2 = std::__cxx11::string::find((char *)&this->resp_,0x10714b);
  lVar3 = std::__cxx11::string::find((char *)&this->resp_,0x107149);
  pcVar1 = (this->resp_)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)local_40,pcVar1 + lVar2 + 2,pcVar1 + lVar3 + 4);
  std::__cxx11::string::operator=((string *)this,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  pcVar1 = (this->resp_)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)local_40,pcVar1 + lVar3 + 4,pcVar1 + (this->resp_)._M_string_length);
  std::__cxx11::string::operator=((string *)&this->body_,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Response::parseRespone()
{
    auto pos1 = resp_.find("\r\n");   // ignore HTTP respone line
    auto pos2 = resp_.find("\r\n\r\n");
    headers_ = std::move(string(resp_.begin()+pos1+2, resp_.begin()+pos2+4));
    body_ = std::move(string(resp_.begin()+pos2+4,resp_.end()));
}